

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FeatureDescription::InternalSwap
          (FeatureDescription *this,FeatureDescription *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  string *psVar1;
  Arena *rhs_arena;
  Arena *lhs_arena;
  FeatureDescription *other_local;
  FeatureDescription *this_local;
  
  rhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  lhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&other->super_MessageLite);
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->name_,rhs_arena_00,&other->name_,lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->shortdescription_,rhs_arena_00,&other->shortdescription_,lhs_arena_00);
  std::swap<CoreML::Specification::FeatureType*>(&this->type_,&other->type_);
  return;
}

Assistant:

void FeatureDescription::InternalSwap(FeatureDescription* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &name_, lhs_arena,
      &other->name_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &shortdescription_, lhs_arena,
      &other->shortdescription_, rhs_arena
  );
  swap(type_, other->type_);
}